

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-ieee.h
# Opt level: O1

void __thiscall
icu_63::double_conversion::Single::NormalizedBoundaries
          (Single *this,DiyFp *out_m_minus,DiyFp *out_m_plus)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint64_t uVar6;
  int exponent;
  int iVar7;
  uint32_t d32;
  int iVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar1 = this->d32_;
  uVar4 = uVar1 & 0x7fffff;
  bVar11 = (uVar1 & 0x7f800000) == 0;
  uVar2 = uVar4 + 0x800000;
  if (bVar11) {
    uVar2 = uVar4;
  }
  iVar8 = -0x95;
  if (!bVar11) {
    iVar8 = (uVar1 >> 0x17 & 0xff) - 0x96;
  }
  uVar3 = (ulong)(uVar2 * 2);
  iVar9 = iVar8 + -1;
  uVar5 = uVar3 + 1;
  iVar7 = iVar9;
  do {
    uVar6 = uVar5 << 10;
    iVar7 = iVar7 + -10;
    uVar10 = uVar5 >> 0x2c;
    uVar5 = uVar6;
  } while (uVar10 == 0);
  for (; -1 < (long)uVar6; uVar6 = uVar6 * 2) {
    iVar7 = iVar7 + -1;
  }
  if ((uVar4 == 0) && ((uVar1 & 0x7f000000) != 0)) {
    uVar3 = (ulong)(uVar2 * 4);
    iVar9 = iVar8 + -2;
  }
  out_m_plus->f_ = uVar6;
  out_m_plus->e_ = iVar7;
  out_m_minus->f_ = uVar3 - 1 << ((char)iVar9 - (char)iVar7 & 0x3fU);
  out_m_minus->e_ = iVar7;
  return;
}

Assistant:

uint32_t AsUint32() const {
    return d32_;
  }